

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-read-bytes.h
# Opt level: O0

int read_bytes(coda_product *product,int64_t byte_offset,int64_t length,void *dst)

{
  ssize_t sVar1;
  int *piVar2;
  char *pcVar3;
  char local_a8 [8];
  char size_str [21];
  char local_88 [8];
  char offset_str_1 [21];
  char local_68 [8];
  char accessed_str [21];
  char local_48 [8];
  char offset_str [21];
  void *dst_local;
  int64_t length_local;
  int64_t byte_offset_local;
  coda_product *product_local;
  
  unique0x100002bc = dst;
  if (product->mem_ptr == (uint8_t *)0x0) {
    if ((product->format != coda_format_ascii) && (product->format != coda_format_binary)) {
      __assert_fail("product->format == coda_format_ascii || product->format == coda_format_binary",
                    "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-read-bytes.h"
                    ,100,"int read_bytes(coda_product *, int64_t, int64_t, void *)");
    }
    if (byte_offset < 0) {
      coda_set_error(-0x12d,"trying to read before the start of the file");
      return -1;
    }
    if ((ulong)product->file_size < (ulong)(byte_offset + length)) {
      coda_set_error(-0x12d,"trying to read beyond the end of the file");
      return -1;
    }
    sVar1 = pread(*(int *)((long)&product[1].filename + 4),dst,length,byte_offset);
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      coda_set_error(-0x16,"could not read from file (%s)",pcVar3);
      return -1;
    }
  }
  else {
    if (byte_offset < 0) {
      if ((product->format != coda_format_ascii) && (product->format != coda_format_binary)) {
        coda_str64(byte_offset,local_48);
        coda_set_error(-0x12d,"trying to read bytes using invalid offset %s",local_48);
        return -1;
      }
      coda_set_error(-0x12d,"trying to read before the start of the file");
      return -1;
    }
    if ((ulong)product->mem_size < (ulong)(byte_offset + length)) {
      if ((product->format != coda_format_ascii) && (product->format != coda_format_binary)) {
        coda_str64(length,local_68);
        coda_str64(byte_offset,local_88);
        coda_str64(product->mem_size,local_a8);
        coda_set_error(-0x12d,"trying to read %s bytes at position %s in block of size %s",local_68,
                       local_88,local_a8);
        return -1;
      }
      coda_set_error(-0x12d,"trying to read beyond the end of the file");
      return -1;
    }
    memcpy(dst,product->mem_ptr + byte_offset,length);
  }
  return 0;
}

Assistant:

static int read_bytes(coda_product *product, int64_t byte_offset, int64_t length, void *dst)
{
    if (product->mem_ptr != NULL)
    {
        if (byte_offset < 0)
        {
            if (product->format == coda_format_ascii || product->format == coda_format_binary)
            {
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read before the start of the file");
                return -1;
            }
            else
            {
                char offset_str[21];

                coda_str64(byte_offset, offset_str);
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read bytes using invalid offset %s",
                               offset_str);
                return -1;
            }
        }
        if (((uint64_t)byte_offset + length) > ((uint64_t)product->mem_size))
        {
            if (product->format == coda_format_ascii || product->format == coda_format_binary)
            {
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read beyond the end of the file");
                return -1;
            }
            else
            {
                char accessed_str[21];
                char offset_str[21];
                char size_str[21];

                coda_str64(length, accessed_str);
                coda_str64(byte_offset, offset_str);
                coda_str64(product->mem_size, size_str);
                coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read %s bytes at position %s in block of "
                               "size %s", accessed_str, offset_str, size_str);
                return -1;
            }
        }
        memcpy(dst, product->mem_ptr + byte_offset, (size_t)length);
    }
    else
    {
        assert(product->format == coda_format_ascii || product->format == coda_format_binary);
        if (byte_offset < 0)
        {
            coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read before the start of the file");
            return -1;
        }
        if (((uint64_t)byte_offset + length) > ((uint64_t)product->file_size))
        {
            coda_set_error(CODA_ERROR_OUT_OF_BOUNDS_READ, "trying to read beyond the end of the file");
            return -1;
        }
#if HAVE_PREAD
        if (pread(((coda_bin_product *)product)->fd, dst, (size_t)length, (off_t)byte_offset) < 0)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
            return -1;
        }
#else
        if (lseek(((coda_bin_product *)product)->fd, (off_t)byte_offset, SEEK_SET) < 0)
        {
            char byte_offset_str[21];

            coda_str64(byte_offset, byte_offset_str);
            coda_set_error(CODA_ERROR_FILE_READ, "could not move to byte position %s (%s)", byte_offset_str,
                           strerror(errno));
            return -1;
        }
        if (read(((coda_bin_product *)product)->fd, dst, (size_t)length) < 0)
        {
            coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
            return -1;
        }
#endif
    }

    return 0;
}